

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

void __thiscall
testing::internal::
FunctionMocker<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_(std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>)>
::UntypedDescribeUninterestingCall
          (FunctionMocker<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_(std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>)>
           *this,void *untyped_args,ostream *os)

{
  ostream *poVar1;
  char *pcVar2;
  
  std::operator<<(os,"Uninteresting mock function call - ");
  DescribeDefaultActionTo(this,(ArgumentTuple *)untyped_args,os);
  poVar1 = std::operator<<(os,"    Function call: ");
  pcVar2 = UntypedFunctionMockerBase::Name(&this->super_UntypedFunctionMockerBase);
  std::operator<<(poVar1,pcVar2);
  PrintTo<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,std::default_delete<solitaire::archivers::interfaces::Snapshot>>>
            ((tuple<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_>
              *)untyped_args,os);
  return;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_gmock_mutex) {
    const ArgumentTuple& args =
        *static_cast<const ArgumentTuple*>(untyped_args);
    *os << "Uninteresting mock function call - ";
    DescribeDefaultActionTo(args, os);
    *os << "    Function call: " << Name();
    UniversalPrint(args, os);
  }